

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::putReplacement(QXmlStreamReaderPrivate *this,QStringView s)

{
  bool bVar1;
  char16_t cVar2;
  pointer this_00;
  uint *puVar3;
  QXmlStreamSimpleStack<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  char16_t c;
  const_reverse_iterator end;
  const_reverse_iterator it;
  reverse_iterator<const_QChar_*> *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  reverse_iterator<const_QChar_*> local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::size(&local_18);
  QXmlStreamSimpleStack<unsigned_int>::reserve
            (in_RDI,CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_20.current = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::rbegin((QStringView *)in_RDI);
  QStringView::rend((QStringView *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<const_QChar_*> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    this_00 = std::reverse_iterator<const_QChar_*>::operator->
                        ((reverse_iterator<const_QChar_*> *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    cVar2 = QChar::unicode(this_00);
    if ((cVar2 == L'\n') || (cVar2 == L'\r')) {
      in_stack_ffffffffffffffb4 = (ushort)cVar2 | 0x1a0000;
      puVar3 = QXmlStreamSimpleStack<unsigned_int>::rawPush
                         ((QXmlStreamSimpleStack<unsigned_int> *)&in_RDI[8].tos);
      *puVar3 = in_stack_ffffffffffffffb4;
    }
    else {
      in_stack_ffffffffffffffb0 = (uint)(ushort)cVar2;
      puVar3 = QXmlStreamSimpleStack<unsigned_int>::rawPush
                         ((QXmlStreamSimpleStack<unsigned_int> *)&in_RDI[8].tos);
      *puVar3 = in_stack_ffffffffffffffb0;
    }
    std::reverse_iterator<const_QChar_*>::operator++(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::putReplacement(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it) {
        char16_t c = it->unicode();
        if (c == '\n' || c == '\r')
            putStack.rawPush() = ((LETTER << 16) | c);
        else
            putStack.rawPush() = c;
    }
}